

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_confidentialaddress.cpp
# Opt level: O2

void __thiscall
ElementsConfidentialAddress_GetBlindingKey_Test::TestBody
          (ElementsConfidentialAddress_GetBlindingKey_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertionResult gtest_ar_2;
  AssertHelper local_558;
  Pubkey confidential_key;
  Privkey blinding_key;
  Privkey master_blinding_key;
  AssertionResult gtest_ar;
  ElementsConfidentialAddress confidential_address;
  Address unblind_addr;
  
  std::__cxx11::string::string
            ((string *)&confidential_address,
             "881a1ab07e99ab0626b4d93b3dddfd16cbc04342ee71aab4da7093e7b853fd80",
             (allocator *)&gtest_ar);
  cfd::core::Privkey::Privkey(&master_blinding_key,(string *)&confidential_address,kMainnet,true);
  std::__cxx11::string::~string((string *)&confidential_address);
  std::__cxx11::string::string
            ((string *)&confidential_address,"ert1q0zln07l8vgm5qf4jhzz00668lfs7xssdlxlysh",
             (allocator *)&blinding_key);
  cfd::core::GetElementsAddressFormatList();
  cfd::core::Address::Address
            (&unblind_addr,(string *)&confidential_address,
             (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             &gtest_ar);
  std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::~vector
            ((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             &gtest_ar);
  std::__cxx11::string::~string((string *)&confidential_address);
  cfd::core::Privkey::Privkey(&blinding_key);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::Address::GetLockingScript((Script *)&confidential_address,&unblind_addr);
      cfd::core::ElementsConfidentialAddress::GetBlindingKey
                ((Privkey *)&gtest_ar,&master_blinding_key,(Script *)&confidential_address);
      cfd::core::Privkey::operator=(&blinding_key,(Privkey *)&gtest_ar);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar);
      cfd::core::Script::~Script((Script *)&confidential_address);
    }
  }
  else {
    testing::Message::Message((Message *)&confidential_address);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialaddress.cpp"
               ,0x227,
               "Expected: (blinding_key = ElementsConfidentialAddress::GetBlindingKey( master_blinding_key, unblind_addr.GetLockingScript())) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar,(Message *)&confidential_address);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&confidential_address);
  }
  cfd::core::Privkey::GetHex_abi_cxx11_((string *)&confidential_address,&blinding_key);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar,
             "\"95af1be4f929e182442c9f3aa55a3cacde69d1182677f3afd618cdfb4a588742\"",
             "blinding_key.GetHex().c_str()",
             "95af1be4f929e182442c9f3aa55a3cacde69d1182677f3afd618cdfb4a588742",
             (char *)confidential_address.unblinded_address_._0_8_);
  std::__cxx11::string::~string((string *)&confidential_address);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&confidential_address);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&confidential_key,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialaddress.cpp"
               ,0x229,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&confidential_key,(Message *)&confidential_address);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&confidential_key);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&confidential_address);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  cfd::core::Privkey::GeneratePubkey(&confidential_key,&blinding_key,true);
  cfd::core::Pubkey::GetHex_abi_cxx11_((string *)&confidential_address,&confidential_key);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar,
             "\"0273f33808de34256679f932410fca27721ce3b287083c903d6c10dfabb600336e\"",
             "confidential_key.GetHex().c_str()",
             "0273f33808de34256679f932410fca27721ce3b287083c903d6c10dfabb600336e",
             (char *)confidential_address.unblinded_address_._0_8_);
  std::__cxx11::string::~string((string *)&confidential_address);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&confidential_address);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialaddress.cpp"
               ,0x22d,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar_2,(Message *)&confidential_address);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&confidential_address);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  cfd::core::ElementsConfidentialAddress::ElementsConfidentialAddress(&confidential_address);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::ElementsConfidentialAddress::ElementsConfidentialAddress
                ((ElementsConfidentialAddress *)&gtest_ar,&unblind_addr,&confidential_key);
      cfd::core::ElementsConfidentialAddress::operator=
                (&confidential_address,(ElementsConfidentialAddress *)&gtest_ar);
      cfd::core::ElementsConfidentialAddress::~ElementsConfidentialAddress
                ((ElementsConfidentialAddress *)&gtest_ar);
    }
  }
  else {
    testing::Message::Message((Message *)&gtest_ar);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialaddress.cpp"
               ,0x231,
               "Expected: (confidential_address = ElementsConfidentialAddress(unblind_addr, confidential_key)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  cfd::core::ElementsConfidentialAddress::GetAddress_abi_cxx11_
            ((string *)&gtest_ar,&confidential_address);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar_2,
             "\"el1qqfelxwqgmc6z2enelyeyzr72yaepecajsuyreypadsgdl2akqqeku79lxla7wc3hgqnt9wyy7l4507npudpq6typz2y9he7wu\""
             ,"confidential_address.GetAddress().c_str()",
             "el1qqfelxwqgmc6z2enelyeyzr72yaepecajsuyreypadsgdl2akqqeku79lxla7wc3hgqnt9wyy7l4507npudpq6typz2y9he7wu"
             ,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
  std::__cxx11::string::~string((string *)&gtest_ar);
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_ar_2.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_558,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialaddress.cpp"
               ,0x234,pcVar2);
    testing::internal::AssertHelper::operator=(&local_558,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper(&local_558);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_2.message_);
  cfd::core::ElementsConfidentialAddress::~ElementsConfidentialAddress(&confidential_address);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&confidential_key);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&blinding_key);
  cfd::core::Address::~Address(&unblind_addr);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&master_blinding_key);
  return;
}

Assistant:

TEST(ElementsConfidentialAddress, GetBlindingKey) {
  const Privkey master_blinding_key(
      "881a1ab07e99ab0626b4d93b3dddfd16cbc04342ee71aab4da7093e7b853fd80");
  Address unblind_addr("ert1q0zln07l8vgm5qf4jhzz00668lfs7xssdlxlysh",
      GetElementsAddressFormatList());

  Privkey blinding_key;
  EXPECT_NO_THROW(
      (blinding_key =
          ElementsConfidentialAddress::GetBlindingKey(
                  master_blinding_key,
                  unblind_addr.GetLockingScript())));
  EXPECT_STREQ("95af1be4f929e182442c9f3aa55a3cacde69d1182677f3afd618cdfb4a588742",
               blinding_key.GetHex().c_str());
  Pubkey confidential_key = blinding_key.GeneratePubkey();
  EXPECT_STREQ(
      "0273f33808de34256679f932410fca27721ce3b287083c903d6c10dfabb600336e",
      confidential_key.GetHex().c_str());
  ElementsConfidentialAddress confidential_address;
  EXPECT_NO_THROW(
      (confidential_address =
          ElementsConfidentialAddress(unblind_addr, confidential_key)));
  EXPECT_STREQ(
      "el1qqfelxwqgmc6z2enelyeyzr72yaepecajsuyreypadsgdl2akqqeku79lxla7wc3hgqnt9wyy7l4507npudpq6typz2y9he7wu",
      confidential_address.GetAddress().c_str());
}